

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

char * get_include_fname(c2m_ctx_t c2m_ctx,token_t t,char **content)

{
  char *name;
  int iVar1;
  char *pcVar2;
  long lVar3;
  str_t sVar4;
  
  *content = (char *)0x0;
  if ((*(short *)t != 0x102) && (*(short *)t != 0x13e)) {
    __assert_fail("t->code == T_STR || t->code == T_HEADER",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x99b,"const char *get_include_fname(c2m_ctx_t, token_t, const char **)");
  }
  name = (t->node->u).s.s;
  if (*name == '/') {
    return name;
  }
  if (*t->repr == '\"') {
    pcVar2 = c2m_ctx->cs->fname;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = get_full_name(c2m_ctx,pcVar2,name,0);
      iVar1 = file_found_p(pcVar2);
      if (iVar1 != 0) goto LAB_0016209b;
    }
    lVar3 = 0;
    do {
      pcVar2 = *(char **)((long)c2m_ctx->header_dirs + lVar3);
      if (pcVar2 == (char *)0x0) goto LAB_0016202f;
      pcVar2 = get_full_name(c2m_ctx,pcVar2,name,1);
      iVar1 = file_found_p(pcVar2);
      lVar3 = lVar3 + 8;
    } while (iVar1 == 0);
  }
  else {
LAB_0016202f:
    for (lVar3 = 8; lVar3 != 0xb8; lVar3 = lVar3 + 0x10) {
      if ((*(char **)(&UNK_001a7ce8 + lVar3) != (char *)0x0) &&
         (iVar1 = strcmp(name,*(char **)(&UNK_001a7ce8 + lVar3)), iVar1 == 0)) {
        *content = *(char **)((long)&standard_includes[0].name + lVar3);
        return name;
      }
    }
    lVar3 = 0;
    do {
      pcVar2 = *(char **)((long)c2m_ctx->system_header_dirs + lVar3);
      if (pcVar2 == (char *)0x0) {
        return name;
      }
      pcVar2 = get_full_name(c2m_ctx,pcVar2,name,1);
      iVar1 = file_found_p(pcVar2);
      lVar3 = lVar3 + 8;
    } while (iVar1 == 0);
  }
LAB_0016209b:
  sVar4 = uniq_cstr(c2m_ctx,pcVar2);
  return sVar4.s;
}

Assistant:

static const char *get_include_fname (c2m_ctx_t c2m_ctx, token_t t, const char **content) {
  const char *fullname, *name;

  *content = NULL;
  assert (t->code == T_STR || t->code == T_HEADER);
  if ((name = t->node->u.s.s)[0] != '/') {
    if (t->repr[0] == '"') {
      /* Search relative to the current source dir */
      if (cs->fname != NULL) {
        fullname = get_full_name (c2m_ctx, cs->fname, name, FALSE);
        if (file_found_p (fullname)) return uniq_cstr (c2m_ctx, fullname).s;
      }
      for (size_t i = 0; header_dirs[i] != NULL; i++) {
        fullname = get_full_name (c2m_ctx, header_dirs[i], name, TRUE);
        if (file_found_p (fullname)) return uniq_cstr (c2m_ctx, fullname).s;
      }
    }
    for (size_t i = 0; i < sizeof (standard_includes) / sizeof (string_include_t); i++)
      if (standard_includes[i].name != NULL && strcmp (name, standard_includes[i].name) == 0) {
        *content = standard_includes[i].content;
        return name;
      }
    for (size_t i = 0; system_header_dirs[i] != NULL; i++) {
      fullname = get_full_name (c2m_ctx, system_header_dirs[i], name, TRUE);
      if (file_found_p (fullname)) return uniq_cstr (c2m_ctx, fullname).s;
    }
  }
  return name;
}